

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPool.cpp
# Opt level: O3

VkResult __thiscall
myvk::QueryPool::GetResults32
          (QueryPool *this,uint32_t first_query,uint32_t query_count,uint32_t *data,
          VkQueryResultFlags flags)

{
  VkResult VVar1;
  
  VVar1 = (*vkGetQueryPoolResults)
                    (((this->m_device_ptr).
                      super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_device
                     ,this->m_query_pool,first_query,query_count,(ulong)query_count << 2,data,4,
                     flags & 0xfffffffe);
  return VVar1;
}

Assistant:

VkResult QueryPool::GetResults32(uint32_t first_query, uint32_t query_count, uint32_t *data,
                                 VkQueryResultFlags flags) const {
	return vkGetQueryPoolResults(m_device_ptr->GetHandle(), m_query_pool, first_query, query_count,
	                             query_count * sizeof(uint32_t), (void *)data, sizeof(uint32_t),
	                             flags & (~VK_QUERY_RESULT_64_BIT));
}